

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O3

double CubicRoot(double x)

{
  double dVar1;
  
  dVar1 = 0.0;
  if ((x != 0.0) || (NAN(x))) {
    if (0.0 <= x) {
      dVar1 = log(x);
      dVar1 = exp(dVar1 / 3.0);
      return dVar1;
    }
    dVar1 = log(-x);
    dVar1 = exp(dVar1 / 3.0);
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

double CubicRoot(double x)
{
	if(x == 0.0)
		return 0.0;
	else if(x < 0.0)
		return -exp(log(-x)/3.0);
	else
		return exp(log(x)/3.0);
}